

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbeglnativeinterfacehandler.cpp
# Opt level: O0

NativeResourceForIntegrationFunction __thiscall
QXcbEglNativeInterfaceHandler::nativeResourceFunctionForIntegration
          (QXcbEglNativeInterfaceHandler *this,QByteArray *resource)

{
  int iVar1;
  NativeResourceForIntegrationFunction local_8;
  
  iVar1 = resourceType((QByteArray *)this);
  if (iVar1 == 0) {
    local_8 = eglDisplay;
  }
  else {
    local_8 = (NativeResourceForIntegrationFunction)0x0;
  }
  return local_8;
}

Assistant:

QPlatformNativeInterface::NativeResourceForIntegrationFunction QXcbEglNativeInterfaceHandler::nativeResourceFunctionForIntegration(const QByteArray &resource) const{
    switch (resourceType(resource)) {
    case EglDisplay:
        return eglDisplay;
    default:
        break;
    }
    return nullptr;
}